

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbndmat.cpp
# Opt level: O0

void __thiscall
TPZFBMatrix<std::complex<float>_>::MultAdd
          (TPZFBMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
          complex<float> alpha,complex<float> beta,int opt)

{
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  undefined4 extraout_var;
  complex<float> *pcVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  complex<float> *__x;
  undefined4 extraout_var_02;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<std::complex<float>_> *in_RDI;
  int in_R8D;
  undefined8 in_XMM1_Qa;
  int64_t i_1;
  complex<float> val_1;
  int64_t end_1;
  int64_t begin_1;
  int64_t i;
  complex<float> val;
  int64_t end;
  int64_t begin;
  int64_t r;
  int64_t ic;
  int64_t xcols;
  int64_t rows;
  complex<float> *in_stack_fffffffffffffec8;
  complex<float> *in_stack_fffffffffffffed8;
  complex<float> *in_stack_fffffffffffffee0;
  long local_110;
  int64_t in_stack_ffffffffffffff10;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff20;
  TPZMatrix<std::complex<float>_> *in_stack_ffffffffffffff28;
  complex<float> in_stack_ffffffffffffff30;
  complex<float> *local_c0;
  undefined8 local_b8;
  complex<float> *local_b0;
  complex<float> *local_a8;
  long local_80;
  undefined8 local_78;
  complex<float> *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  int64_t local_48;
  undefined8 local_40;
  int local_34;
  long *local_30;
  TPZBaseMatrix *local_28;
  TPZBaseMatrix *local_20;
  undefined8 local_10;
  
  local_34 = in_R8D;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_10 = in_XMM1_Qa;
  if (in_R8D == 0) {
    in_stack_ffffffffffffff10 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RDI);
    iVar2 = TPZBaseMatrix::Rows(local_20);
    if (in_stack_ffffffffffffff10 == iVar2) goto LAB_013ca501;
LAB_013ca52a:
    iVar1 = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    TPZMatrix<std::complex<float>_>::Error((char *)begin,(char *)end);
  }
  else {
LAB_013ca501:
    iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
    iVar3 = TPZBaseMatrix::Rows(local_20);
    iVar1 = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    if (iVar2 != iVar3) goto LAB_013ca52a;
  }
  iVar2 = TPZBaseMatrix::Cols(local_20);
  iVar3 = TPZBaseMatrix::Cols(local_28);
  if (iVar2 == iVar3) {
    iVar2 = TPZBaseMatrix::Rows(local_20);
    iVar3 = TPZBaseMatrix::Rows(local_28);
    if (iVar2 == iVar3) goto LAB_013ca5a8;
  }
  TPZMatrix<std::complex<float>_>::Error((char *)begin,(char *)end);
LAB_013ca5a8:
  local_40 = local_10;
  TPZMatrix<std::complex<float>_>::PrepareZ
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_RDI,in_stack_ffffffffffffff30,
             iVar1);
  local_48 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  local_50 = TPZBaseMatrix::Cols(local_20);
  if (local_34 == 0) {
    for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
      for (local_60 = 0; local_60 < local_48; local_60 = local_60 + 1) {
        if (local_60 - (long)(in_RDI->fPivot).super_TPZVec<int>.fStore < 1) {
          local_110 = 0;
        }
        else {
          local_110 = local_60 - (long)(in_RDI->fPivot).super_TPZVec<int>.fStore;
        }
        local_68 = local_110;
        lVar4 = local_60 + (in_RDI->fPivot).super_TPZVec<int>.fNElements;
        iVar1 = (*(in_RDI->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                  super_TPZSavable._vptr_TPZSavable[0xc])();
        if (lVar4 + 1 < CONCAT44(extraout_var,iVar1)) {
          pcVar5 = (complex<float> *)(local_60 + (in_RDI->fPivot).super_TPZVec<int>.fNElements + 1);
        }
        else {
          iVar1 = (*(in_RDI->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                    super_TPZSavable._vptr_TPZSavable[0xc])();
          pcVar5 = (complex<float> *)CONCAT44(extraout_var_00,iVar1);
        }
        local_70 = pcVar5;
        local_78 = (**(code **)(*local_30 + 0x120))(local_30,local_60,local_58);
        for (local_80 = local_68; local_80 < (long)local_70; local_80 = local_80 + 1) {
          (*(in_RDI->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(in_RDI,local_60,local_80);
          std::operator*(in_stack_fffffffffffffec8,(complex<float> *)0x13ca798);
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0x24])(local_20,local_80,local_58);
          std::operator*(in_stack_fffffffffffffec8,(complex<float> *)0x13ca7e3);
          std::complex<float>::operator+=(pcVar5,in_stack_fffffffffffffed8);
        }
        (**(code **)(*local_30 + 0x118))(local_30,local_60,local_58,&local_78);
      }
    }
  }
  else {
    for (local_58 = 0; local_58 < local_50; local_58 = local_58 + 1) {
      for (local_60 = 0; local_60 < local_48; local_60 = local_60 + 1) {
        if (local_60 - (long)(in_RDI->fPivot).super_TPZVec<int>.fStore < 1) {
          pcVar5 = (complex<float> *)0x0;
        }
        else {
          pcVar5 = (complex<float> *)(local_60 - (long)(in_RDI->fPivot).super_TPZVec<int>.fStore);
        }
        lVar4 = local_60 + (in_RDI->fPivot).super_TPZVec<int>.fNElements;
        local_a8 = pcVar5;
        iVar1 = (*(in_RDI->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                  super_TPZSavable._vptr_TPZSavable[0xc])();
        if (lVar4 + 1 < CONCAT44(extraout_var_01,iVar1)) {
          __x = (complex<float> *)(local_60 + (in_RDI->fPivot).super_TPZVec<int>.fNElements + 1);
        }
        else {
          iVar1 = (*(in_RDI->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                    super_TPZSavable._vptr_TPZSavable[0xc])();
          __x = (complex<float> *)CONCAT44(extraout_var_02,iVar1);
        }
        local_b0 = __x;
        local_b8 = (**(code **)(*local_30 + 0x120))(local_30,local_60,local_58);
        for (local_c0 = local_a8; (long)local_c0 < (long)local_b0;
            local_c0 = (complex<float> *)((long)&local_c0->_M_value + 1)) {
          (*(in_RDI->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(in_RDI,local_c0,local_60);
          std::operator*(__x,(complex<float> *)0x13ca9eb);
          (*(local_20->super_TPZSavable)._vptr_TPZSavable[0x24])(local_20,local_c0,local_58);
          std::operator*(__x,(complex<float> *)0x13caa27);
          std::complex<float>::operator+=(in_stack_fffffffffffffee0,pcVar5);
        }
        (**(code **)(*local_30 + 0x118))(local_30,local_60,local_58,&local_b8);
      }
    }
  }
  return;
}

Assistant:

void TPZFBMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
						  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error(__PRETTY_FUNCTION__, "TPZFBMatrix::MultAdd <matrixs with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Rows() != y.Rows()) {
		this->Error(__PRETTY_FUNCTION__,"TPZFBMatrix::MultAdd incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);
	int64_t rows = this->Rows();
	int64_t xcols = x.Cols();
	int64_t ic, r;
	if(opt == 0) {
		for (ic = 0; ic < xcols; ic++) {
			int64_t begin, end;
			for ( r = 0; r < rows; r++ ) {
				begin = MAX( r - fBandLower, 0 );
				end   = MIN( r + fBandUpper + 1, Dim() );
				TVar val = z.GetVal(r,ic);
				// Calcula um elemento da resposta.
				for ( int64_t i = begin ; i < end; i++ ) val += alpha * GetVal( r, i ) * x.GetVal( i, ic );
				z.PutVal( r, ic, val );
			}
		}
	} else {
		for (ic = 0; ic < xcols; ic++) {
			int64_t begin, end;
			for ( r = 0; r < rows; r++ ) {
				begin = MAX( r - fBandLower, 0 );
				end   = MIN( r + fBandUpper + 1, Dim() );
				TVar val = z.GetVal(r,ic);
				// Calcula um elemento da resposta.
				for ( int64_t i = begin ; i < end; i++ ) val += alpha * GetVal( i, r ) * x.GetVal( i, ic );
				z.PutVal( r, ic, val );
			}
		}
	}
}